

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O1

int setbf(match *res,bitfield *bf,ull num)

{
  ull uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar7 = num - bf->addend ^ bf->xorend;
  if (bf->lut != (ull *)0x0) {
    iVar2 = bf->sbf[1].len + bf->sbf[0].len;
    uVar3 = 1 << ((byte)iVar2 & 0x1f);
    uVar6 = 0;
    if (iVar2 != 0x1f) {
      uVar4 = 1;
      if (1 < (int)uVar3) {
        uVar4 = (ulong)uVar3;
      }
      uVar5 = 0;
      do {
        uVar6 = uVar5;
        if (bf->lut[uVar5] == uVar7) break;
        uVar5 = uVar5 + 1;
        uVar6 = uVar4;
      } while (uVar4 != uVar5);
    }
    uVar7 = uVar6 & 0xffffffff;
    if ((uint)uVar6 == uVar3) {
      return 0;
    }
  }
  uVar7 = uVar7 >> ((byte)bf->shr & 0x3f);
  setsbf(res,bf->sbf[0].pos,bf->sbf[0].len,uVar7);
  setsbf(res,bf->sbf[1].pos,bf->sbf[1].len,uVar7 >> ((byte)bf->sbf[0].len & 0x3f));
  uVar1 = getbf_as(bf,res->a,res->m);
  return (uint)(uVar1 == num);
}

Assistant:

static int setbf (struct match *res, const struct bitfield *bf, ull num) {
	ull onum = num;
	num = (num - bf->addend) ^ bf->xorend;
	if (bf->lut) {
		int max = 1 << (bf->sbf[0].len + bf->sbf[1].len);
		int j = 0;
		for (j = 0; j < max; j++)
			if (bf->lut[j] == num)
				break;
		if (j == max)
			return 0;
		num = j;
	}
	num >>= bf->shr;
	setsbf(res, bf->sbf[0].pos, bf->sbf[0].len, num);
	num >>= bf->sbf[0].len;
	setsbf(res, bf->sbf[1].pos, bf->sbf[1].len, num);
	ull mask = ~0ull;
	return (getbf_as(bf, res->a, res->m) & mask) == (onum & mask);
}